

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forestlstm_var1.h
# Opt level: O2

void __thiscall cnn::ForestLSTMBuilder_var1::~ForestLSTMBuilder_var1(ForestLSTMBuilder_var1 *this)

{
  (this->super_RNNBuilder)._vptr_RNNBuilder = (_func_int **)&PTR__ForestLSTMBuilder_var1_003774f0;
  std::_Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::~_Vector_base
            (&(this->c0).
              super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>);
  std::_Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::~_Vector_base
            (&(this->h0).
              super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>);
  std::_Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::~_Vector_base
            (&(this->i_w).
              super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>);
  std::_Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>::~_Vector_base
            (&(this->wparams).
              super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>);
  std::
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  ::~vector(&this->c);
  std::
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  ::~vector(&this->h);
  std::
  vector<std::vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>,_std::allocator<std::vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>_>_>
  ::~vector(&this->fparam_vars);
  std::
  vector<std::vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>,_std::allocator<std::vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>_>_>
  ::~vector(&this->iocparam_vars);
  std::
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  ::~vector(&this->param_vars);
  std::
  vector<std::vector<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>,_std::allocator<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>_>,_std::allocator<std::vector<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>,_std::allocator<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>_>_>_>
  ::~vector(&this->fparams);
  std::
  vector<std::vector<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>,_std::allocator<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>_>,_std::allocator<std::vector<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>,_std::allocator<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>_>_>_>
  ::~vector(&this->iocparams);
  std::
  vector<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>,_std::allocator<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>_>
  ::~vector(&this->params);
  RNNBuilder::~RNNBuilder(&this->super_RNNBuilder);
  return;
}

Assistant:

ForestLSTMBuilder_var1() = default;